

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O2

void __thiscall
BVSparse<Memory::JitArenaAllocator>::CopyFromNode<Memory::JitArenaAllocator>
          (BVSparse<Memory::JitArenaAllocator> *this,BVSparseNode<Memory::JitArenaAllocator> *node2)

{
  Type TVar1;
  Type pJVar2;
  BVSparse<Memory::JitArenaAllocator> *pBVar3;
  BVSparse<Memory::JitArenaAllocator> *pBVar4;
  BVSparse<Memory::JitArenaAllocator> *pBVar5;
  
  this->lastFoundIndex = (Type_conflict)0x0;
  pBVar4 = (BVSparse<Memory::JitArenaAllocator> *)this->head;
  pBVar5 = this;
  for (; (pBVar4 != (BVSparse<Memory::JitArenaAllocator> *)0x0 &&
         (node2 != (BVSparseNode<Memory::JitArenaAllocator> *)0x0)); node2 = node2->next) {
    TVar1 = (node2->data).word;
    pBVar3 = pBVar4;
    if (TVar1 != 0) {
      *(Type *)&pBVar4->lastFoundIndex = node2->startIndex;
      ((Type *)&pBVar4->alloc)->word = TVar1;
      pBVar3 = (BVSparse<Memory::JitArenaAllocator> *)pBVar4->head;
      pBVar5 = pBVar4;
    }
    pBVar4 = pBVar3;
  }
  if (pBVar4 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    for (; node2 != (BVSparseNode<Memory::JitArenaAllocator> *)0x0; node2 = node2->next) {
      pBVar4 = pBVar5;
      if ((node2->data).word != 0) {
        pBVar4 = (BVSparse<Memory::JitArenaAllocator> *)
                 Allocate(this,node2->startIndex,(BVSparseNode *)0x0);
        ((Type *)&pBVar4->alloc)->word = (node2->data).word;
        pBVar5->head = (Type_conflict)pBVar4;
      }
      pBVar5 = pBVar4;
    }
  }
  else {
    pJVar2 = this->alloc;
    while (pBVar4 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      this->lastFoundIndex = (Type_conflict)0x0;
      pBVar3 = (BVSparse<Memory::JitArenaAllocator> *)pBVar4->head;
      pBVar4->head = pJVar2->bvFreeList;
      pJVar2->bvFreeList = (BVSparseNode *)pBVar4;
      this->lastUsedNodePrevNextField = &this->head;
      pBVar4 = pBVar3;
    }
    pBVar5->head = (Type)0x0;
  }
  return;
}

Assistant:

void
BVSparse<TAllocator>::CopyFromNode(const ::BVSparseNode<TSrcAllocator> * node2)
{
    BVSparseNode * node1 = this->head;
    Field(BVSparseNode*, TAllocator)* prevNextField = &this->head;
    this->lastFoundIndex = nullptr;

    while (node1 != nullptr && node2 != nullptr)
    {
        if (!node2->data.IsEmpty())
        {
            node1->startIndex = node2->startIndex;
            node1->data.Copy(node2->data);
            prevNextField = &node1->next;
            node1 = node1->next;
        }

        node2 = node2->next;
    }

    if (node1 != nullptr)
    {
        while (node1 != nullptr)
        {
            node1 = this->DeleteNode(node1);
        }
        *prevNextField = nullptr;
    }
    else
    {
        while (node2 != nullptr)
        {
            if (!node2->data.IsEmpty())
            {
                BVSparseNode * newNode = Allocate(node2->startIndex, nullptr);
                newNode->data.Copy(node2->data);
                *prevNextField = newNode;
                prevNextField = &newNode->next;
            }
            node2 = node2->next;
        }
    }
}